

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mattran.c
# Opt level: O0

MATRIX mat_tran(MATRIX A)

{
  long in_RDI;
  MATRIX At;
  int j;
  int i;
  undefined8 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe8;
  int iVar1;
  int in_stack_ffffffffffffffec;
  int iVar2;
  MATRIX local_8;
  
  local_8 = mat_creat(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                      (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  if (local_8 == (MATRIX)0x0) {
    local_8 = (MATRIX)0x0;
  }
  else {
    for (iVar2 = 0; iVar2 < *(int *)(in_RDI + -4); iVar2 = iVar2 + 1) {
      for (iVar1 = 0; iVar1 < *(int *)(in_RDI + -8); iVar1 = iVar1 + 1) {
        local_8[iVar2][iVar1] = *(double *)(*(long *)(in_RDI + (long)iVar1 * 8) + (long)iVar2 * 8);
      }
    }
  }
  return local_8;
}

Assistant:

MATRIX mat_tran( MATRIX A )
{
	int	i, j;
	MATRIX	At;

	if ((At = mat_creat( MatCol(A), MatRow(A), UNDEFINED )) == NULL)
		return (NULL);

	/*
	*	Transposing ...
	*/
	for (i=0; i<MatCol(A); i++)
	for (j=0; j<MatRow(A); j++)
		{
		At[i][j] = A[j][i];
		}
	return (At);
}